

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

ImageChannelDesc * __thiscall
pbrt::Image::GetChannelDesc
          (ImageChannelDesc *__return_storage_ptr__,Image *this,
          span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          requestedChannels)

{
  __type _Var1;
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar2;
  ulong uVar3;
  memory_resource *pmVar4;
  size_type sVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  long lVar7;
  size_t j;
  ulong uVar8;
  ImageChannelDesc desc;
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> local_60;
  
  local_60.alloc.memoryResource = pstd::pmr::new_delete_resource();
  local_60.ptr = (int *)0x0;
  local_60.nAlloc = 0;
  local_60.nStored = 0;
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::resize
            (&local_60,requestedChannels.n);
  sVar5 = 0;
  do {
    if (sVar5 == requestedChannels.n) {
      InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::InlinedVector
                (&__return_storage_ptr__->offset,&local_60);
      goto LAB_004673d3;
    }
    lVar7 = 0;
    for (uVar8 = 0; uVar3 = (this->channelNames).nStored, uVar8 < uVar3; uVar8 = uVar8 + 1) {
      pbVar6 = (this->channelNames).ptr;
      if (pbVar6 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(this->channelNames).field_2;
      }
      _Var1 = std::operator==(requestedChannels.ptr + sVar5,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&pbVar6->_M_dataplus + lVar7));
      if (_Var1) {
        paVar2 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                  *)local_60.ptr;
        if ((anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
             *)local_60.ptr ==
            (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
             *)0x0) {
          paVar2 = &local_60.field_2;
        }
        paVar2->fixed[sVar5] = (int)uVar8;
        uVar3 = (this->channelNames).nStored;
        break;
      }
      lVar7 = lVar7 + 0x20;
    }
    sVar5 = sVar5 + 1;
  } while (uVar3 != uVar8);
  pmVar4 = pstd::pmr::new_delete_resource();
  (__return_storage_ptr__->offset).alloc.memoryResource = pmVar4;
  (__return_storage_ptr__->offset).ptr = (int *)0x0;
  (__return_storage_ptr__->offset).nAlloc = 0;
  (__return_storage_ptr__->offset).nStored = 0;
LAB_004673d3:
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector(&local_60);
  return __return_storage_ptr__;
}

Assistant:

ImageChannelDesc Image::GetChannelDesc(
    pstd::span<const std::string> requestedChannels) const {
    ImageChannelDesc desc;
    desc.offset.resize(requestedChannels.size());
    for (size_t i = 0; i < requestedChannels.size(); ++i) {
        size_t j;
        for (j = 0; j < channelNames.size(); ++j)
            if (requestedChannels[i] == channelNames[j]) {
                desc.offset[i] = j;
                break;
            }
        if (j == channelNames.size())
            return {};
    }

    return desc;
}